

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

void LogLuv24toXYZ(uint32_t p,float *XYZ)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double y;
  double x;
  double s;
  double v;
  double u;
  double L;
  float *pfStack_18;
  int Ce;
  float *XYZ_local;
  uint32_t p_local;
  
  pfStack_18 = XYZ;
  XYZ_local._4_4_ = p;
  u = LogL10toY(p >> 0xe & 0x3ff);
  if (0.0 < u) {
    L._4_4_ = XYZ_local._4_4_ & 0x3fff;
    iVar1 = uv_decode(&v,&s,L._4_4_);
    if (iVar1 < 0) {
      v = 0.210526316;
      s = 0.473684211;
    }
    dVar2 = 1.0 / (v * 6.0 + -(s * 16.0) + 12.0);
    dVar3 = v * 9.0 * dVar2;
    dVar2 = s * 4.0 * dVar2;
    *pfStack_18 = (float)((dVar3 / dVar2) * u);
    pfStack_18[1] = (float)u;
    pfStack_18[2] = (float)((((1.0 - dVar3) - dVar2) / dVar2) * u);
  }
  else {
    pfStack_18[2] = 0.0;
    pfStack_18[1] = 0.0;
    *pfStack_18 = 0.0;
  }
  return;
}

Assistant:

void
    LogLuv24toXYZ(uint32_t p, float *XYZ)
{
    int Ce;
    double L, u, v, s, x, y;
    /* decode luminance */
    L = LogL10toY(p >> 14 & 0x3ff);
    if (L <= 0.)
    {
        XYZ[0] = XYZ[1] = XYZ[2] = 0.;
        return;
    }
    /* decode color */
    Ce = p & 0x3fff;
    if (uv_decode(&u, &v, Ce) < 0)
    {
        u = U_NEU;
        v = V_NEU;
    }
    s = 1. / (6. * u - 16. * v + 12.);
    x = 9. * u * s;
    y = 4. * v * s;
    /* convert to XYZ */
    XYZ[0] = (float)(x / y * L);
    XYZ[1] = (float)L;
    XYZ[2] = (float)((1. - x - y) / y * L);
}